

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O1

Node * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::CreateNewNode
          (DefaultValueObjectWriter *this,string *name,Type *type,NodeKind kind,DataPiece *data,
          bool is_placeholder,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *path,bool suppress_empty_list,bool preserve_proto_field_names,bool use_ints_for_enums,
          FieldScrubCallBack *field_scrub_callback)

{
  _Manager_type p_Var1;
  Node *this_00;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  Node *local_38;
  
  this_00 = (Node *)operator_new(0xc0);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = field_scrub_callback->_M_invoker;
  p_Var1 = (field_scrub_callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(field_scrub_callback->super__Function_base)._M_functor;
    local_58._8_8_ =
         *(undefined8 *)((long)&(field_scrub_callback->super__Function_base)._M_functor + 8);
    (field_scrub_callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    field_scrub_callback->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  local_38 = this_00;
  Node::Node(this_00,name,type,kind,data,is_placeholder,path,suppress_empty_list,
             preserve_proto_field_names,use_ints_for_enums,(FieldScrubCallBack *)&local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return this_00;
}

Assistant:

DefaultValueObjectWriter::Node* DefaultValueObjectWriter::CreateNewNode(
    const std::string& name, const google::protobuf::Type* type, NodeKind kind,
    const DataPiece& data, bool is_placeholder,
    const std::vector<std::string>& path, bool suppress_empty_list,
    bool preserve_proto_field_names, bool use_ints_for_enums,
    FieldScrubCallBack field_scrub_callback) {
  return new Node(name, type, kind, data, is_placeholder, path,
                  suppress_empty_list, preserve_proto_field_names,
                  use_ints_for_enums, std::move(field_scrub_callback));
}